

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedShaderImpl.cpp
# Opt level: O1

void __thiscall
Diligent::SerializedShaderImpl::QueryInterface
          (SerializedShaderImpl *this,INTERFACE_ID *IID,IObject **ppInterface)

{
  bool bVar1;
  
  if (ppInterface == (IObject **)0x0) {
    return;
  }
  bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_SerializedShader);
  if (((!bVar1) && (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_Shader), !bVar1)) &&
     (bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)IID_InternalImpl), !bVar1)) {
    *ppInterface = (IObject *)0x0;
    bVar1 = INTERFACE_ID::operator==(IID,(INTERFACE_ID *)Diligent::IID_Unknown);
    if (!bVar1) {
      return;
    }
  }
  *ppInterface = (IObject *)this;
  (*(this->super_ObjectBase<Diligent::ISerializedShader>).
    super_RefCountedObject<Diligent::ISerializedShader>.super_ISerializedShader.super_IShader.
    super_IDeviceObject.super_IObject._vptr_IObject[1])(this);
  return;
}

Assistant:

void DILIGENT_CALL_TYPE SerializedShaderImpl::QueryInterface(const INTERFACE_ID& IID, IObject** ppInterface)
{
    if (ppInterface == nullptr)
        return;
    if (IID == IID_SerializedShader || IID == IID_Shader || IID == IID_InternalImpl)
    {
        *ppInterface = this;
        (*ppInterface)->AddRef();
    }
    else
    {
        TBase::QueryInterface(IID, ppInterface);
    }
}